

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

void Abc_NtkDressPrintEquivs(Vec_Ptr_t *vRes)

{
  uint uVar1;
  Vec_Int_t *p;
  uint i;
  int i_00;
  
  for (i = 0; (int)i < vRes->nSize; i = i + 1) {
    p = (Vec_Int_t *)Vec_PtrEntry(vRes,i);
    printf("Class %5d : ",(ulong)i);
    printf("Num =%5d    ",(ulong)(uint)p->nSize);
    for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
      uVar1 = Vec_IntEntry(p,i_00);
      printf("%5d%c%d ",(ulong)(uint)((int)uVar1 >> 2),(ulong)((uVar1 & 2) + 0x2b),
             (ulong)(uVar1 & 1));
    }
    putchar(10);
  }
  return;
}

Assistant:

void Abc_NtkDressPrintEquivs( Vec_Ptr_t * vRes )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_PtrForEachEntry( Vec_Int_t *, vRes, vClass, i )
    {
        printf( "Class %5d : ", i );
        printf( "Num =%5d    ", Vec_IntSize(vClass) );
        Vec_IntForEachEntry( vClass, Entry, k )
            printf( "%5d%c%d ", 
                Abc_ObjEquivId2ObjId(Entry), 
                Abc_ObjEquivId2Polar(Entry)? '-':'+', 
                Abc_ObjEquivId2NtkId(Entry) );
        printf( "\n" );
    }
}